

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::App::_parse_config(App *this,vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *args)

{
  bool bVar1;
  reference pCVar2;
  ConfigError *__return_storage_ptr__;
  string local_b0;
  undefined1 local_80 [8];
  ConfigItem item;
  iterator __end2;
  iterator __begin2;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__range2;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *args_local;
  App *this_local;
  
  __end2 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::begin(args);
  item.inputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::end(args);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                                *)&item.inputs.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) {
      return;
    }
    pCVar2 = __gnu_cxx::
             __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
             ::operator*(&__end2);
    ConfigItem::ConfigItem((ConfigItem *)local_80,pCVar2);
    bVar1 = _parse_single_config(this,(ConfigItem *)local_80,0);
    if ((!bVar1) && (this->allow_config_extras_ == error)) break;
    ConfigItem::~ConfigItem((ConfigItem *)local_80);
    __gnu_cxx::
    __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
    ::operator++(&__end2);
  }
  __return_storage_ptr__ = (ConfigError *)__cxa_allocate_exception(0x38);
  ConfigItem::fullname_abi_cxx11_(&local_b0,(ConfigItem *)local_80);
  ConfigError::Extras(__return_storage_ptr__,&local_b0);
  __cxa_throw(__return_storage_ptr__,&ConfigError::typeinfo,ConfigError::~ConfigError);
}

Assistant:

void _parse_config(std::vector<ConfigItem> &args) {
        for(ConfigItem item : args) {
            if(!_parse_single_config(item) && allow_config_extras_ == config_extras_mode::error)
                throw ConfigError::Extras(item.fullname());
        }
    }